

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_test.c
# Opt level: O3

void test_url_query_param(void)

{
  char cVar1;
  nng_err num;
  int iVar2;
  uint32_t uVar3;
  char *pcVar4;
  char *pcVar5;
  nng_url *local_38;
  nng_url *url;
  
  num = nng_url_parse(&local_38,"http://www.google.com?color=red");
  pcVar4 = nng_strerror(num);
  iVar2 = acutest_check_((uint)(num == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                         ,0xbf,"%s: expected success, got %s (%d)",
                         "nng_url_parse(&url, \"http://www.google.com?color=red\")",pcVar4,num);
  if (iVar2 != 0) {
    iVar2 = acutest_check_((uint)(local_38 != (nng_url *)0x0),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                           ,0xc0,"%s","url != NULL");
    if (iVar2 != 0) {
      pcVar4 = nng_url_scheme(local_38);
      iVar2 = strcmp(pcVar4,"http");
      pcVar4 = nng_url_scheme(local_38);
      acutest_check_((uint)(iVar2 == 0),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                     ,0xc1,"%s == %s",pcVar4,"http");
      pcVar4 = nng_url_hostname(local_38);
      iVar2 = strcmp(pcVar4,"www.google.com");
      pcVar4 = nng_url_hostname(local_38);
      acutest_check_((uint)(iVar2 == 0),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                     ,0xc2,"%s == %s",pcVar4,"www.google.com");
      pcVar4 = nng_url_path(local_38);
      cVar1 = *pcVar4;
      pcVar4 = nng_url_path(local_38);
      acutest_check_((uint)(cVar1 == '\0'),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                     ,0xc3,"%s == %s",pcVar4,"");
      uVar3 = nng_url_port(local_38);
      acutest_check_((uint)(uVar3 == 0x50),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                     ,0xc4,"%s","nng_url_port(url) == 80");
      pcVar4 = nng_url_query(local_38);
      iVar2 = strcmp(pcVar4,"color=red");
      pcVar4 = nng_url_query(local_38);
      acutest_check_((uint)(iVar2 == 0),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                     ,0xc5,"%s == %s",pcVar4,"color=red");
      iVar2 = acutest_check_((uint)(local_38 != (nng_url *)0x0),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                             ,0xc6,"%s","url != NULL");
      if (iVar2 != 0) {
        pcVar4 = nng_url_userinfo(local_38);
        pcVar5 = nng_url_userinfo(local_38);
        acutest_check_((uint)(pcVar4 == (char *)0x0),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                       ,199,"%p == NULL",pcVar5);
        nng_url_free(local_38);
        return;
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_url_query_param(void)
{
	nng_url *url;
	NUTS_PASS(nng_url_parse(&url, "http://www.google.com?color=red"));
	NUTS_ASSERT(url != NULL);
	NUTS_MATCH(nng_url_scheme(url), "http");
	NUTS_MATCH(nng_url_hostname(url), "www.google.com");
	NUTS_MATCH(nng_url_path(url), "");
	NUTS_TRUE(nng_url_port(url) == 80);
	NUTS_MATCH(nng_url_query(url), "color=red");
	NUTS_ASSERT(url != NULL);
	NUTS_NULL(nng_url_userinfo(url));
	nng_url_free(url);
}